

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  
  iVar2 = test_snprintf(0,"xxxxxxxxx",-1);
  if (((((iVar2 != 0) || (iVar2 = test_snprintf(1,anon_var_dwarf_1bf13 + 9,-1), iVar2 != 0)) ||
       (iVar2 = test_snprintf(2,"1",-1), iVar2 != 0)) ||
      ((iVar2 = test_snprintf(3,"12",-1), iVar2 != 0 ||
       (iVar2 = test_snprintf(4,"123",3), iVar2 != 0)))) ||
     (iVar2 = test_snprintf(5,"123",3), iVar2 != 0)) {
    puts("the snprintf implementation is broken");
    goto LAB_0010c5ad;
  }
  if (argc == 2) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"--quiet");
    iVar22 = 0;
    bVar1 = true;
    if ((iVar2 != 0) && (((*__s1 != '-' || (__s1[1] != 'q')) || (__s1[2] != '\0'))))
    goto LAB_0010c428;
  }
  else {
LAB_0010c428:
    putchar(10);
    iVar22 = 1;
    bVar1 = false;
  }
  iVar2 = mbedtls_md5_self_test(iVar22);
  iVar3 = mbedtls_ripemd160_self_test(iVar22);
  uVar23 = (iVar2 != 0) + 1;
  if (iVar3 == 0) {
    uVar23 = (uint)(iVar2 != 0);
  }
  iVar2 = mbedtls_sha1_self_test(iVar22);
  iVar3 = mbedtls_sha256_self_test(iVar22);
  iVar4 = mbedtls_sha512_self_test(iVar22);
  iVar5 = mbedtls_arc4_self_test(iVar22);
  iVar6 = mbedtls_des_self_test(iVar22);
  iVar7 = mbedtls_aes_self_test(iVar22);
  iVar8 = mbedtls_gcm_self_test(iVar22);
  iVar9 = mbedtls_ccm_self_test(iVar22);
  iVar10 = mbedtls_base64_self_test(iVar22);
  iVar11 = mbedtls_mpi_self_test(iVar22);
  iVar12 = mbedtls_rsa_self_test(iVar22);
  iVar13 = mbedtls_x509_self_test(iVar22);
  iVar14 = mbedtls_xtea_self_test(iVar22);
  iVar15 = mbedtls_camellia_self_test(iVar22);
  iVar16 = mbedtls_ctr_drbg_self_test(iVar22);
  iVar17 = mbedtls_hmac_drbg_self_test(iVar22);
  iVar18 = mbedtls_ecp_self_test(iVar22);
  iVar19 = mbedtls_dhm_self_test(iVar22);
  iVar20 = mbedtls_entropy_self_test(iVar22);
  iVar21 = mbedtls_pkcs5_self_test(iVar22);
  iVar22 = mbedtls_timing_self_test(iVar22);
  uVar23 = (((((((((((((((((((((uVar23 - (iVar2 == 0)) - (uint)(iVar3 == 0)) - (uint)(iVar4 == 0)) -
                            (uint)(iVar5 == 0)) - (uint)(iVar6 == 0)) - (uint)(iVar7 == 0)) + 0x15)
                        - (uint)(iVar8 == 0)) - (uint)(iVar9 == 0)) - (uint)(iVar10 == 0)) -
                     (uint)(iVar11 == 0)) - (uint)(iVar12 == 0)) - (uint)(iVar13 == 0)) -
                  (uint)(iVar14 == 0)) - (uint)(iVar15 == 0)) - (uint)(iVar16 == 0)) -
               (uint)(iVar17 == 0)) - (uint)(iVar18 == 0)) - (uint)(iVar19 == 0)) -
            (uint)(iVar20 == 0)) - (uint)(iVar21 == 0)) - (uint)(iVar22 == 0);
  if (bVar1) {
    if (uVar23 == 0) {
      return 0;
    }
  }
  else {
    printf("  Executed %d test suites\n\n",0x17);
    if (uVar23 == 0) {
      puts("  [ All tests PASS ]\n");
      return 0;
    }
    printf("  [ %d tests FAIL ]\n\n",(ulong)uVar23);
  }
LAB_0010c5ad:
  exit(1);
}

Assistant:

int main( int argc, char *argv[] )
{
    int v, suites_tested = 0, suites_failed = 0;
#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C) && defined(MBEDTLS_SELF_TEST)
    unsigned char buf[1000000];
#endif
    void *pointer;

    /*
     * The C standard doesn't guarantee that all-bits-0 is the representation
     * of a NULL pointer. We do however use that in our code for initializing
     * structures, which should work on every modern platform. Let's be sure.
     */
    memset( &pointer, 0, sizeof( void * ) );
    if( pointer != NULL )
    {
        mbedtls_printf( "all-bits-zero is not a NULL pointer\n" );
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    /*
     * Make sure we have a snprintf that correctly zero-terminates
     */
    if( run_test_snprintf() != 0 )
    {
        mbedtls_printf( "the snprintf implementation is broken\n" );
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    if( argc == 2 && ( strcmp( argv[1], "--quiet" ) == 0  ||
        strcmp( argv[1], "-q" ) == 0 ) )
    {
        v = 0;
    }
    else
    {
        v = 1;
        mbedtls_printf( "\n" );
    }

#if defined(MBEDTLS_SELF_TEST)

#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C)
    mbedtls_memory_buffer_alloc_init( buf, sizeof(buf) );
#endif

#if defined(MBEDTLS_MD2_C)
    if( mbedtls_md2_self_test( v )  != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_MD4_C)
    if( mbedtls_md4_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_MD5_C)
    if( mbedtls_md5_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_RIPEMD160_C)
    if( mbedtls_ripemd160_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA1_C)
    if( mbedtls_sha1_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA256_C)
    if( mbedtls_sha256_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_SHA512_C)
    if( mbedtls_sha512_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ARC4_C)
    if( mbedtls_arc4_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_DES_C)
    if( mbedtls_des_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_AES_C)
    if( mbedtls_aes_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_GCM_C) && defined(MBEDTLS_AES_C)
    if( mbedtls_gcm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CCM_C) && defined(MBEDTLS_AES_C)
    if( mbedtls_ccm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CMAC_C)
    if( ( mbedtls_cmac_self_test( v ) ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_BASE64_C)
    if( mbedtls_base64_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_BIGNUM_C)
    if( mbedtls_mpi_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_rsa_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_X509_USE_C)
    if( mbedtls_x509_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_XTEA_C)
    if( mbedtls_xtea_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CAMELLIA_C)
    if( mbedtls_camellia_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_CTR_DRBG_C)
    if( mbedtls_ctr_drbg_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( mbedtls_hmac_drbg_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_ecp_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ECJPAKE_C)
    if( mbedtls_ecjpake_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_DHM_C)
    if( mbedtls_dhm_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_ENTROPY_C)

#if defined(MBEDTLS_ENTROPY_NV_SEED) && !defined(MBEDTLS_NO_PLATFORM_ENTROPY)
    create_entropy_seed_file();
#endif

    if( mbedtls_entropy_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#if defined(MBEDTLS_PKCS5_C)
    if( mbedtls_pkcs5_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

/* Slow tests last */

#if defined(MBEDTLS_TIMING_C)
    if( mbedtls_timing_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

    if( v != 0 )
    {
#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C) && defined(MBEDTLS_MEMORY_DEBUG)
        mbedtls_memory_buffer_alloc_status();
#endif
    }

#if defined(MBEDTLS_MEMORY_BUFFER_ALLOC_C)
    mbedtls_memory_buffer_alloc_free();
    if( mbedtls_memory_buffer_alloc_self_test( v ) != 0 )
    {
        suites_failed++;
    }
    suites_tested++;
#endif

#else
    mbedtls_printf( " MBEDTLS_SELF_TEST not defined.\n" );
#endif

    if( v != 0 )
    {
        mbedtls_printf( "  Executed %d test suites\n\n", suites_tested );

        if( suites_failed > 0)
        {
            mbedtls_printf( "  [ %d tests FAIL ]\n\n", suites_failed );
        }
        else
        {
            mbedtls_printf( "  [ All tests PASS ]\n\n" );
        }
#if defined(_WIN32)
        mbedtls_printf( "  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif
    }

    if( suites_failed > 0)
        mbedtls_exit( MBEDTLS_EXIT_FAILURE );

    /* return() is here to prevent compiler warnings */
    return( MBEDTLS_EXIT_SUCCESS );
}